

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86::forward
          (DeconvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  Layer *pLVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  sbyte sVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  Mat *pMVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  void *pvVar40;
  undefined4 *puVar41;
  int iVar42;
  int iVar43;
  undefined1 (*pauVar44) [16];
  int iVar45;
  long lVar46;
  int iVar47;
  ulong uVar48;
  ulong uVar49;
  void *pvVar50;
  byte bVar51;
  int iVar52;
  ulong uVar53;
  int iVar54;
  uint uVar55;
  int x;
  undefined1 auVar56 [16];
  undefined1 extraout_var [12];
  float fVar57;
  float fVar59;
  float fVar60;
  v4sf one;
  undefined1 auVar58 [16];
  float fVar61;
  float fVar62;
  float fVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [12];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_2d4;
  int local_2d0;
  int local_298;
  Mat local_278;
  void *local_230;
  ulong local_228;
  ulong local_220;
  float *local_218;
  void *local_210;
  undefined1 local_208 [40];
  undefined1 auStack_1e0 [16];
  ulong uStack_1d0;
  size_t local_1c8;
  Mat *local_1b8;
  ulong local_1b0;
  undefined1 (*local_1a8) [16];
  long local_1a0;
  undefined1 local_198 [40];
  undefined1 local_170 [16];
  int local_160;
  size_t local_158;
  ulong local_150;
  undefined1 local_148 [16];
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  Allocator *local_128;
  int local_120;
  Allocator *local_118;
  undefined1 local_110 [16];
  int local_100;
  ulong local_f8;
  void *local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  ulong local_d8;
  int local_d0;
  Allocator *local_c8;
  undefined1 local_c0 [16];
  int local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  void *local_90;
  long local_88;
  void *local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  
  iVar33 = bottom_blob->w;
  iVar52 = bottom_blob->h;
  local_210 = (void *)(ulong)(uint)bottom_blob->c;
  local_220 = (ulong)bottom_blob->elempack;
  iVar54 = (this->super_DeconvolutionDepthWise).dilation_w;
  iVar43 = (this->super_DeconvolutionDepthWise).stride_w;
  iVar42 = ((this->super_DeconvolutionDepthWise).kernel_h + -1) *
           (this->super_DeconvolutionDepthWise).dilation_h;
  uVar28 = (this->super_DeconvolutionDepthWise).num_output;
  iVar47 = (this->super_DeconvolutionDepthWise).stride_h;
  bVar51 = (uVar28 & 3) == 0 & opt->use_packing_layout;
  iVar38 = (this->super_DeconvolutionDepthWise).kernel_w;
  iVar37 = (this->super_DeconvolutionDepthWise).output_pad_right;
  iVar45 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  sVar13 = bVar51 * '\x02';
  uVar48 = bottom_blob->elemsize / local_220 << sVar13;
  local_278.cstep = 0;
  local_278.data = (void *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize = 0;
  local_278.elempack = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  auVar58._0_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_left);
  auVar58._4_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_right);
  auVar58._8_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_top);
  auVar58._12_4_ = -(uint)(0 < (this->super_DeconvolutionDepthWise).pad_bottom);
  iVar27 = movmskps((int)&local_278.dims,auVar58);
  lVar39 = 0x10;
  if ((iVar27 == 0) &&
     (((this->super_DeconvolutionDepthWise).output_w < 1 ||
      ((this->super_DeconvolutionDepthWise).output_h < 1)))) {
    if (&local_278 != top_blob) {
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_278.data = top_blob->data;
      local_278.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_278.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_278.elemsize = top_blob->elemsize;
      local_278.elempack = top_blob->elempack;
      local_278.allocator = top_blob->allocator;
      uVar14 = top_blob->dims;
      uVar15 = top_blob->w;
      local_278.h = top_blob->h;
      local_278.d = top_blob->d;
      local_278.c = top_blob->c;
      local_278.cstep = top_blob->cstep;
      local_278.dims = uVar14;
      local_278.w = uVar15;
    }
    uVar28 = (this->super_DeconvolutionDepthWise).num_output;
    lVar39 = 8;
  }
  iVar54 = (iVar38 + -1) * iVar54;
  iVar43 = (iVar33 + -1) * iVar43 + iVar54 + iVar37 + 1;
  iVar47 = iVar45 + 1 + (iVar52 + -1) * iVar47 + iVar42;
  uVar55 = (uint)bVar51 * 3 + 1;
  local_1b8 = top_blob;
  Mat::create(&local_278,iVar43,iVar47,(int)uVar28 / (int)uVar55,uVar48,uVar55,
              *(Allocator **)(&opt->lightmode + lVar39));
  auVar70 = _DAT_005f0a60;
  auVar58 = _DAT_005f0a20;
  local_2d0 = -100;
  if ((local_278.data == (void *)0x0) || ((long)local_278.c * local_278.cstep == 0))
  goto LAB_00463989;
  iVar38 = (this->super_DeconvolutionDepthWise).num_output;
  iVar27 = (int)local_210;
  iVar45 = (int)local_220;
  iVar37 = (this->super_DeconvolutionDepthWise).group;
  if (iVar37 == iVar38 && iVar27 * iVar45 == iVar37) {
    uVar28 = (this->super_DeconvolutionDepthWise).kernel_h *
             (this->super_DeconvolutionDepthWise).kernel_w;
    local_a0 = (ulong)uVar28;
    if (iVar45 == 1) {
      if (0 < iVar27) {
        local_80 = local_278.data;
        local_88 = local_278.cstep * local_278.elemsize;
        local_230 = (this->weight_data_tm).data;
        iVar38 = bottom_blob->w;
        local_90 = bottom_blob->data;
        sVar5 = bottom_blob->elemsize;
        local_98 = bottom_blob->cstep * sVar5;
        local_150 = 1;
        if (1 < iVar27) {
          local_150 = (ulong)local_210 & 0xffffffff;
        }
        local_220 = (long)(int)uVar28 << 2;
        local_228 = 0;
        do {
          pvVar40 = local_90;
          if (0 < iVar47) {
            lVar39 = local_98 * local_228;
            puVar41 = (undefined4 *)(local_88 * local_228 + (long)local_80);
            uVar28 = (this->super_DeconvolutionDepthWise).kernel_h;
            local_1a8 = (undefined1 (*) [16])
                        CONCAT44(local_1a8._4_4_,(this->super_DeconvolutionDepthWise).bias_term);
            iVar37 = 0;
            local_1b0 = (ulong)((this->super_DeconvolutionDepthWise).activation_type - 1);
            do {
              if (0 < iVar43) {
                local_210 = (this->super_DeconvolutionDepthWise).bias_data.data;
                iVar45 = (this->super_DeconvolutionDepthWise).dilation_h;
                local_218 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                iVar27 = 0;
                local_2d4 = -iVar54;
                do {
                  if ((int)local_1a8 == 0) {
                    auVar69 = ZEXT812(0);
                  }
                  else {
                    auVar69._4_8_ = 0;
                    auVar69._0_4_ = *(uint *)((long)local_210 + local_228 * 4);
                  }
                  auVar70._12_4_ = 0;
                  auVar70._0_12_ = auVar69;
                  local_1a0 = CONCAT44(local_1a0._4_4_,iVar27);
                  if (0 < (int)uVar28) {
                    iVar29 = (this->super_DeconvolutionDepthWise).stride_h;
                    uVar55 = (this->super_DeconvolutionDepthWise).kernel_w;
                    iVar30 = (this->super_DeconvolutionDepthWise).stride_w;
                    uVar48 = 0;
                    pvVar50 = local_230;
                    do {
                      iVar34 = iVar45 * (int)uVar48 + (iVar37 - iVar42);
                      if (((-1 < iVar34) &&
                          (iVar35 = iVar34 / iVar29, iVar35 < iVar52 && iVar34 % iVar29 == 0)) &&
                         (0 < (int)uVar55)) {
                        uVar49 = 0;
                        iVar34 = local_2d4;
                        do {
                          if ((-1 < iVar34) &&
                             (iVar36 = iVar34 / iVar30, iVar36 < iVar33 && iVar34 % iVar30 == 0)) {
                            auVar70._0_4_ =
                                 auVar70._0_4_ +
                                 *(float *)((long)pvVar50 + uVar49 * 4) *
                                 *(float *)((long)pvVar40 +
                                           (long)iVar36 * 4 +
                                           (long)iVar35 * (long)iVar38 * sVar5 + lVar39);
                          }
                          uVar49 = uVar49 + 1;
                          iVar34 = iVar34 + (this->super_DeconvolutionDepthWise).dilation_w;
                        } while (uVar55 != uVar49);
                      }
                      uVar48 = uVar48 + 1;
                      pvVar50 = (void *)((long)pvVar50 + (ulong)uVar55 * 4);
                    } while (uVar48 != uVar28);
                  }
                  fVar57 = auVar70._0_4_;
                  auVar63 = auVar70;
                  if ((uint)local_1b0 < 6) {
                    switch((long)&switchD_0046351f::switchdataD_005fc0e0 +
                           (long)(int)(&switchD_0046351f::switchdataD_005fc0e0)[local_1b0]) {
                    case 0x463521:
                      if (fVar57 <= 0.0) {
                        auVar56._12_4_ = 0;
                        auVar56._0_12_ = auVar70._4_12_;
                        auVar63 = auVar56 << 0x20;
                      }
                      break;
                    case 0x463531:
                      local_148 = auVar70;
                      fVar57 = expf(fVar57);
                      fVar57 = logf(fVar57 + 1.0);
                      fVar57 = tanhf(fVar57);
                      auVar63._0_4_ = fVar57 * (float)local_148._0_4_;
                      auVar63._4_12_ = extraout_var;
                      break;
                    case 0x463561:
                      if (fVar57 <= *local_218) {
                        auVar70._0_4_ = *local_218;
                      }
                      fVar57 = local_218[1];
                      auVar63 = auVar70;
                      if (fVar57 < auVar70._0_4_) {
LAB_0046367d:
                        auVar63 = ZEXT416((uint)fVar57);
                      }
                      break;
                    case 0x463584:
                      if (88.37626 <= fVar57) {
                        fVar57 = 88.37626;
                      }
                      fVar57 = expf((float)(-(uint)(fVar57 < -88.37626) & 0x42b0c0a5 |
                                           ~-(uint)(fVar57 < -88.37626) & (uint)-fVar57));
                      auVar63 = ZEXT416((uint)(1.0 / (fVar57 + 1.0)));
                      break;
                    case 0x4635cc:
                      auVar63 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar57) & (uint)*local_218 |
                                                      -(uint)(0.0 < fVar57) & 0x3f800000) * fVar57))
                      ;
                      break;
                    case 0x463619:
                      fVar59 = *local_218;
                      fVar60 = -local_218[1] / fVar59;
                      auVar63 = ZEXT816(0);
                      if ((fVar60 <= fVar57) && (auVar63 = auVar70, fVar57 <= fVar60 + 1.0 / fVar59)
                         ) {
                        fVar57 = (fVar59 * fVar57 + local_218[1]) * fVar57;
                        goto LAB_0046367d;
                      }
                    }
                  }
                  *puVar41 = auVar63._0_4_;
                  puVar41 = puVar41 + 1;
                  iVar27 = iVar27 + 1;
                  local_2d4 = local_2d4 + 1;
                } while (iVar27 != iVar43);
              }
              iVar37 = iVar37 + 1;
            } while (iVar37 != iVar47);
          }
          local_228 = local_228 + 1;
          local_230 = (void *)((long)local_230 + local_220);
        } while (local_228 != local_150);
      }
    }
    else if ((iVar45 == 4) && (0 < iVar27)) {
      local_150 = CONCAT44(local_150._4_4_,uVar28 * 4);
      local_218 = (float *)CONCAT44(local_218._4_4_,-iVar54);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_148._8_8_;
      local_148 = auVar66 << 0x40;
      auVar56 = (undefined1  [16])0x0;
      fVar57 = (float)DAT_005f0a60;
      fVar59 = DAT_005f0a60._4_4_;
      fVar60 = DAT_005f0a60._8_4_;
      auVar63 = _DAT_005f0a30;
      do {
        if (0 < iVar47) {
          pvVar40 = (this->weight_data_tm).data;
          sVar5 = bottom_blob->cstep;
          sVar6 = bottom_blob->elemsize;
          pvVar50 = bottom_blob->data;
          pauVar44 = (undefined1 (*) [16])
                     (local_278.cstep * local_148._0_8_ * local_278.elemsize + (long)local_278.data)
          ;
          local_1a0 = (long)bottom_blob->w * sVar6;
          local_228 = local_148._0_8_ * 0x10;
          local_230 = (void *)((ulong)local_230 & 0xffffffff00000000);
          do {
            if (0 < iVar43) {
              iVar38 = 0;
              local_298 = -iVar54;
              do {
                local_1a8 = pauVar44;
                local_1b0 = CONCAT44(local_1b0._4_4_,iVar38);
                if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                  auVar72 = ZEXT816(0);
                }
                else {
                  auVar72 = *(undefined1 (*) [16])
                             ((long)(this->super_DeconvolutionDepthWise).bias_data.data + local_228)
                  ;
                }
                lVar39 = (long)(this->super_DeconvolutionDepthWise).kernel_h;
                if (0 < lVar39) {
                  iVar37 = (this->super_DeconvolutionDepthWise).stride_h;
                  uVar55 = (this->super_DeconvolutionDepthWise).kernel_w;
                  iVar45 = (this->super_DeconvolutionDepthWise).stride_w;
                  uVar48 = 0;
                  lVar46 = 0;
                  do {
                    iVar27 = (this->super_DeconvolutionDepthWise).dilation_h * (int)lVar46 +
                             ((int)local_230 - iVar42);
                    if ((((-1 < iVar27) && (iVar29 = iVar27 / iVar37, iVar27 % iVar37 == 0)) &&
                        (iVar29 < iVar52)) && (0 < (int)uVar55)) {
                      uVar49 = (ulong)uVar55;
                      uVar53 = uVar48;
                      auVar66 = auVar72;
                      iVar27 = local_298;
                      do {
                        auVar72 = auVar66;
                        if ((-1 < iVar27) &&
                           (iVar30 = iVar27 / iVar45, iVar30 < iVar33 && iVar27 % iVar45 == 0)) {
                          auVar73 = *(undefined1 (*) [16])
                                     ((long)pvVar50 +
                                     (long)(iVar30 << 2) * 4 +
                                     iVar29 * local_1a0 + sVar5 * local_148._0_8_ * sVar6);
                          pfVar1 = (float *)((long)pvVar40 +
                                            (uVar53 & 0xffffffff) * 4 +
                                            (long)(int)(uVar28 * 4 * local_148._0_4_) * 4);
                          auVar72._0_4_ = auVar66._0_4_ + *pfVar1 * auVar73._0_4_;
                          auVar72._4_4_ = auVar66._4_4_ + pfVar1[1] * auVar73._4_4_;
                          auVar72._8_4_ = auVar66._8_4_ + pfVar1[2] * auVar73._8_4_;
                          auVar72._12_4_ = auVar66._12_4_ + pfVar1[3] * auVar73._12_4_;
                        }
                        iVar27 = iVar27 + (this->super_DeconvolutionDepthWise).dilation_w;
                        uVar53 = uVar53 + 4;
                        uVar49 = uVar49 - 1;
                        auVar66 = auVar72;
                      } while (uVar49 != 0);
                    }
                    lVar46 = lVar46 + 1;
                    uVar48 = uVar48 + (ulong)uVar55 * 4;
                  } while (lVar46 != lVar39);
                }
                fVar62 = auVar72._4_4_;
                fVar75 = auVar72._8_4_;
                fVar68 = auVar72._12_4_;
                fVar61 = auVar70._12_4_;
                switch((this->super_DeconvolutionDepthWise).activation_type) {
                case 1:
                  auVar72 = maxps(auVar72,auVar56);
                  break;
                case 2:
                  auVar66 = maxps(auVar72,auVar56);
                  auVar73 = minps(auVar72,auVar56);
                  fVar61 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar72._4_4_ = fVar61 * auVar73._4_4_ + auVar66._4_4_;
                  auVar72._0_4_ = fVar61 * auVar73._0_4_ + auVar66._0_4_;
                  auVar72._8_4_ = fVar61 * auVar73._8_4_ + auVar66._8_4_;
                  auVar72._12_4_ = fVar61 * auVar73._12_4_ + auVar66._12_4_;
                  break;
                case 3:
                  puVar41 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar2 = *puVar41;
                  uVar3 = puVar41[1];
                  auVar65._4_4_ = uVar2;
                  auVar65._0_4_ = uVar2;
                  auVar65._8_4_ = uVar2;
                  auVar65._12_4_ = uVar2;
                  auVar66 = maxps(auVar72,auVar65);
                  auVar12._4_4_ = uVar3;
                  auVar12._0_4_ = uVar3;
                  auVar12._8_4_ = uVar3;
                  auVar12._12_4_ = uVar3;
                  auVar72 = minps(auVar66,auVar12);
                  break;
                case 4:
                  auVar71._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
                  auVar71._8_4_ = -fVar75;
                  auVar71._12_4_ = -fVar68;
                  auVar66 = minps(auVar71,auVar58);
                  auVar66 = maxps(auVar66,auVar63);
                  fVar75 = auVar66._0_4_ * 1.442695 + 0.5;
                  fVar79 = auVar66._4_4_ * 1.442695 + 0.5;
                  fVar81 = auVar66._8_4_ * 1.442695 + 0.5;
                  fVar74 = auVar66._12_4_ * 1.442695 + 0.5;
                  fVar62 = (float)(int)fVar75;
                  fVar68 = (float)(int)fVar79;
                  fVar80 = (float)(int)fVar81;
                  fVar82 = (float)(int)fVar74;
                  fVar62 = fVar62 - (float)(-(uint)(fVar75 < fVar62) & (uint)fVar57);
                  fVar68 = fVar68 - (float)(-(uint)(fVar79 < fVar68) & (uint)fVar59);
                  fVar80 = fVar80 - (float)(-(uint)(fVar81 < fVar80) & (uint)fVar60);
                  fVar82 = fVar82 - (float)(-(uint)(fVar74 < fVar82) & (uint)fVar61);
                  fVar75 = fVar62 * -0.6931472 + auVar66._0_4_;
                  fVar79 = fVar68 * -0.6931472 + auVar66._4_4_;
                  fVar81 = fVar80 * -0.6931472 + auVar66._8_4_;
                  fVar74 = fVar82 * -0.6931472 + auVar66._12_4_;
                  auVar11._4_4_ =
                       (float)((int)fVar68 * 0x800000 + (int)fVar59) *
                       (fVar79 + fVar59 +
                       (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79
                         + 0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5) * fVar79 * fVar79) +
                       fVar59;
                  auVar11._0_4_ =
                       (float)((int)fVar62 * 0x800000 + (int)fVar57) *
                       (fVar75 + fVar57 +
                       (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75
                         + 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75) +
                       fVar57;
                  auVar11._8_4_ =
                       (float)((int)fVar80 * 0x800000 + (int)fVar60) *
                       (fVar81 + fVar60 +
                       (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81
                         + 0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81) +
                       fVar60;
                  auVar11._12_4_ =
                       (float)((int)fVar82 * 0x800000 + (int)fVar61) *
                       (fVar74 + fVar61 +
                       (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74
                         + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74) +
                       fVar61;
                  auVar72 = divps(auVar70,auVar11);
                  break;
                case 5:
                  auVar56 = minps(auVar72,auVar58);
                  auVar63 = maxps(auVar56,auVar63);
                  fVar79 = auVar63._0_4_ * 1.442695 + 0.5;
                  fVar80 = auVar63._4_4_ * 1.442695 + 0.5;
                  fVar81 = auVar63._8_4_ * 1.442695 + 0.5;
                  fVar82 = auVar63._12_4_ * 1.442695 + 0.5;
                  fVar74 = (float)(int)fVar79;
                  fVar76 = (float)(int)fVar80;
                  fVar77 = (float)(int)fVar81;
                  fVar78 = (float)(int)fVar82;
                  fVar74 = fVar74 - (float)(-(uint)(fVar79 < fVar74) & (uint)fVar57);
                  fVar76 = fVar76 - (float)(-(uint)(fVar80 < fVar76) & (uint)fVar59);
                  fVar77 = fVar77 - (float)(-(uint)(fVar81 < fVar77) & (uint)fVar60);
                  fVar78 = fVar78 - (float)(-(uint)(fVar82 < fVar78) & (uint)fVar61);
                  fVar79 = auVar63._0_4_ - fVar74 * 0.6931472;
                  fVar80 = auVar63._4_4_ - fVar76 * 0.6931472;
                  fVar81 = auVar63._8_4_ - fVar77 * 0.6931472;
                  fVar82 = auVar63._12_4_ - fVar78 * 0.6931472;
                  auVar83._0_4_ =
                       (float)((int)fVar74 * 0x800000 + (int)fVar57) *
                       (fVar79 + fVar57 +
                       (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79
                         + 0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5) * fVar79 * fVar79) +
                       fVar57;
                  auVar83._4_4_ =
                       (float)((int)fVar76 * 0x800000 + (int)fVar59) *
                       (fVar80 + fVar59 +
                       (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80
                         + 0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5) * fVar80 * fVar80) +
                       fVar59;
                  auVar83._8_4_ =
                       (float)((int)fVar77 * 0x800000 + (int)fVar60) *
                       (fVar81 + fVar60 +
                       (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81
                         + 0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81) +
                       fVar60;
                  auVar83._12_4_ =
                       (float)((int)fVar78 * 0x800000 + (int)fVar61) *
                       (fVar82 + fVar61 +
                       (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82
                         + 0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5) * fVar82 * fVar82) +
                       fVar61;
                  auVar63 = maxps(auVar83,_DAT_005f0ad0);
                  fVar79 = (float)(auVar63._0_4_ & 0x807fffff | 0x3f000000);
                  fVar81 = (float)(auVar63._4_4_ & 0x807fffff | 0x3f000000);
                  fVar74 = (float)(auVar63._8_4_ & 0x807fffff | 0x3f000000);
                  fVar77 = (float)(auVar63._12_4_ & 0x807fffff | 0x3f000000);
                  fVar80 = fVar79 + -1.0 + (float)(-(uint)(fVar79 < 0.70710677) & (uint)fVar79);
                  fVar82 = fVar81 + -1.0 + (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar81);
                  fVar76 = fVar74 + -1.0 + (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar74);
                  fVar78 = fVar77 + -1.0 + (float)(-(uint)(fVar77 < 0.70710677) & (uint)fVar77);
                  auVar64._0_8_ =
                       CONCAT44(-(uint)(auVar83._4_4_ <= 0.0),-(uint)(auVar83._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar64._8_4_ = -(uint)(auVar83._8_4_ <= 0.0) & 0x7fffffff;
                  auVar64._12_4_ = -(uint)(auVar83._12_4_ <= 0.0) & 0x7fffffff;
                  auVar9._4_4_ = ~-(uint)(auVar83._4_4_ <= 0.0) &
                                 (uint)((((float)(int)((auVar63._4_4_ >> 0x17) - 0x7e) -
                                         (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar59)) *
                                         0.6931472 + fVar82 +
                                        (((((((((fVar82 * 0.070376836 + -0.1151461) * fVar82 +
                                               0.116769984) * fVar82 + -0.12420141) * fVar82 +
                                             0.14249323) * fVar82 + -0.16668057) * fVar82 +
                                           0.20000714) * fVar82 + -0.24999994) * fVar82 + 0.3333333)
                                         * fVar82 + -0.5) * fVar82 * fVar82) * -2.0);
                  auVar9._0_4_ = ~-(uint)(auVar83._0_4_ <= 0.0) &
                                 (uint)((((float)(int)((auVar63._0_4_ >> 0x17) - 0x7e) -
                                         (float)(-(uint)(fVar79 < 0.70710677) & (uint)fVar57)) *
                                         0.6931472 + fVar80 +
                                        (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 +
                                               0.116769984) * fVar80 + -0.12420141) * fVar80 +
                                             0.14249323) * fVar80 + -0.16668057) * fVar80 +
                                           0.20000714) * fVar80 + -0.24999994) * fVar80 + 0.3333333)
                                         * fVar80 + -0.5) * fVar80 * fVar80) * -2.0);
                  auVar9._8_4_ = ~-(uint)(auVar83._8_4_ <= 0.0) &
                                 (uint)((((float)(int)((auVar63._8_4_ >> 0x17) - 0x7e) -
                                         (float)(-(uint)(fVar74 < 0.70710677) & (uint)fVar60)) *
                                         0.6931472 + fVar76 +
                                        (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 +
                                               0.116769984) * fVar76 + -0.12420141) * fVar76 +
                                             0.14249323) * fVar76 + -0.16668057) * fVar76 +
                                           0.20000714) * fVar76 + -0.24999994) * fVar76 + 0.3333333)
                                         * fVar76 + -0.5) * fVar76 * fVar76) * -2.0);
                  auVar9._12_4_ =
                       ~-(uint)(auVar83._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar63._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar77 < 0.70710677) & (uint)fVar61)) * 0.6931472 +
                               fVar78 + (((((((((fVar78 * 0.070376836 + -0.1151461) * fVar78 +
                                               0.116769984) * fVar78 + -0.12420141) * fVar78 +
                                             0.14249323) * fVar78 + -0.16668057) * fVar78 +
                                           0.20000714) * fVar78 + -0.24999994) * fVar78 + 0.3333333)
                                         * fVar78 + -0.5) * fVar78 * fVar78) * -2.0);
                  auVar63 = minps(auVar64 | auVar9,auVar58);
                  auVar63 = maxps(auVar63,_DAT_005f0a30);
                  fVar79 = auVar63._0_4_ * 1.442695 + 0.5;
                  fVar80 = auVar63._4_4_ * 1.442695 + 0.5;
                  fVar81 = auVar63._8_4_ * 1.442695 + 0.5;
                  fVar82 = auVar63._12_4_ * 1.442695 + 0.5;
                  fVar74 = (float)(int)fVar79;
                  fVar76 = (float)(int)fVar80;
                  fVar77 = (float)(int)fVar81;
                  fVar78 = (float)(int)fVar82;
                  fVar74 = fVar74 - (float)(-(uint)(fVar79 < fVar74) & (uint)fVar57);
                  fVar76 = fVar76 - (float)(-(uint)(fVar80 < fVar76) & (uint)fVar59);
                  fVar77 = fVar77 - (float)(-(uint)(fVar81 < fVar77) & (uint)fVar60);
                  fVar78 = fVar78 - (float)(-(uint)(fVar82 < fVar78) & (uint)fVar61);
                  fVar79 = auVar63._0_4_ - fVar74 * 0.6931472;
                  fVar80 = auVar63._4_4_ - fVar76 * 0.6931472;
                  fVar81 = auVar63._8_4_ - fVar77 * 0.6931472;
                  fVar82 = auVar63._12_4_ - fVar78 * 0.6931472;
                  auVar56 = ZEXT816(0);
                  auVar10._4_4_ =
                       (float)((int)fVar76 * 0x800000 + (int)fVar59) *
                       (fVar80 + fVar59 +
                       (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80
                         + 0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5) * fVar80 * fVar80) +
                       fVar59;
                  auVar10._0_4_ =
                       (float)((int)fVar74 * 0x800000 + (int)fVar57) *
                       (fVar79 + fVar57 +
                       (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) * fVar79
                         + 0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5) * fVar79 * fVar79) +
                       fVar57;
                  auVar10._8_4_ =
                       (float)((int)fVar77 * 0x800000 + (int)fVar60) *
                       (fVar81 + fVar60 +
                       (((((fVar81 * 0.00019875691 + 0.0013981999) * fVar81 + 0.008333452) * fVar81
                         + 0.041665796) * fVar81 + 0.16666666) * fVar81 + 0.5) * fVar81 * fVar81) +
                       fVar60;
                  auVar10._12_4_ =
                       (float)((int)fVar78 * 0x800000 + (int)fVar61) *
                       (fVar82 + fVar61 +
                       (((((fVar82 * 0.00019875691 + 0.0013981999) * fVar82 + 0.008333452) * fVar82
                         + 0.041665796) * fVar82 + 0.16666666) * fVar82 + 0.5) * fVar82 * fVar82) +
                       fVar61;
                  auVar63 = divps(_DAT_005f16e0,auVar10);
                  auVar67._0_4_ = auVar63._0_4_ + -1.0;
                  auVar67._4_4_ = auVar63._4_4_ + -1.0;
                  auVar67._8_4_ = auVar63._8_4_ + -1.0;
                  auVar67._12_4_ = auVar63._12_4_ + -1.0;
                  auVar63 = _DAT_005f0a30;
                  goto LAB_00462c67;
                case 6:
                  pfVar1 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
                  fVar61 = *pfVar1;
                  fVar79 = pfVar1[1];
                  auVar73._0_4_ = fVar61 * auVar72._0_4_ + fVar79;
                  auVar73._4_4_ = fVar61 * fVar62 + fVar79;
                  auVar73._8_4_ = fVar61 * fVar75 + fVar79;
                  auVar73._12_4_ = fVar61 * fVar68 + fVar79;
                  auVar66 = maxps(auVar73,auVar56);
                  auVar67 = minps(auVar66,auVar70);
LAB_00462c67:
                  auVar72._0_4_ = auVar72._0_4_ * auVar67._0_4_;
                  auVar72._4_4_ = fVar62 * auVar67._4_4_;
                  auVar72._8_4_ = fVar75 * auVar67._8_4_;
                  auVar72._12_4_ = fVar68 * auVar67._12_4_;
                }
                *local_1a8 = auVar72;
                pauVar44 = local_1a8 + 1;
                iVar38 = iVar38 + 1;
                local_298 = local_298 + 1;
              } while (iVar38 != iVar43);
            }
            iVar38 = (int)local_230 + 1;
            local_230 = (void *)CONCAT44(local_230._4_4_,iVar38);
          } while (iVar38 != iVar47);
        }
        pvVar40 = (void *)(local_148._0_8_ + 1);
        local_148._0_8_ = pvVar40;
      } while (pvVar40 != local_210);
    }
  }
  else {
    uVar31 = (iVar27 * iVar45) / iVar37;
    uVar32 = iVar38 / iVar37;
    iVar33 = 1;
    uVar28 = 1;
    if (opt->use_packing_layout == true) {
      iVar33 = (uint)((uVar31 & 3) == 0) * 3 + 1;
      uVar28 = (uint)((uVar32 & 3) == 0) * 3 + 1;
    }
    local_198._0_8_ = bottom_blob->data;
    piVar4 = bottom_blob->refcount;
    local_198._8_4_ = SUB84(piVar4,0);
    local_198._12_4_ = (undefined4)((ulong)piVar4 >> 0x20);
    local_198._16_8_ = bottom_blob->elemsize;
    local_198._24_4_ = bottom_blob->elempack;
    local_198._32_8_ = bottom_blob->allocator;
    local_170._0_4_ = bottom_blob->dims;
    local_170._4_4_ = bottom_blob->w;
    local_170._8_4_ = bottom_blob->h;
    local_170._12_4_ = bottom_blob->d;
    local_160 = bottom_blob->c;
    local_158 = bottom_blob->cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    if (iVar33 < iVar45) {
      local_208._0_8_ = *(undefined8 *)opt;
      local_208._16_8_ = opt->workspace_allocator;
      uVar16 = opt->openmp_blocktime;
      uVar17 = opt->use_winograd_convolution;
      uVar19 = opt->use_sgemm_convolution;
      uVar21 = opt->use_int8_inference;
      uVar23 = opt->use_vulkan_compute;
      uVar22 = CONCAT11(uVar23,uVar21);
      uVar20 = CONCAT21(uVar22,uVar19);
      uVar18 = CONCAT31(uVar20,uVar17);
      local_208._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
      auStack_1e0._0_4_ = opt->vulkan_device_index;
      auStack_1e0[4] = opt->use_reserved_1;
      auStack_1e0[5] = opt->use_image_storage;
      auStack_1e0[6] = opt->use_tensor_storage;
      auStack_1e0[7] = opt->use_reserved_2;
      auStack_1e0._8_4_ = opt->flush_denormals;
      auStack_1e0[0xc] = opt->use_local_pool_allocator;
      auStack_1e0[0xd] = opt->use_shader_local_memory;
      auStack_1e0[0xe] = opt->use_cooperative_matrix;
      auStack_1e0[0xf] = opt->use_winograd23_convolution;
      uStack_1d0._0_1_ = opt->use_winograd43_convolution;
      uStack_1d0._1_1_ = opt->use_winograd63_convolution;
      uStack_1d0._2_1_ = opt->use_a53_a55_optimized_kernel;
      uStack_1d0._3_1_ = opt->use_fp16_uniform;
      uStack_1d0._4_1_ = opt->use_int8_uniform;
      uStack_1d0._5_1_ = opt->use_reserved_9;
      uStack_1d0._6_1_ = opt->use_reserved_10;
      uStack_1d0._7_1_ = opt->use_reserved_11;
      local_208._8_4_ = SUB84(opt->workspace_allocator,0);
      local_208._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_208._24_4_ = uVar16;
      local_208._28_4_ = uVar18;
      convert_packing(bottom_blob,(Mat *)local_198,iVar33,(Option *)local_208);
      if ((void *)local_198._0_8_ == (void *)0x0) {
        local_2d0 = -100;
        bVar8 = false;
      }
      else {
        if ((long)local_160 * local_158 != 0) goto LAB_00462e39;
        bVar8 = false;
        local_2d0 = -100;
      }
    }
    else {
LAB_00462e39:
      piVar4 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
      local_208._0_8_ = local_278.data;
      local_208._8_4_ = local_278.refcount._0_4_;
      local_208._12_4_ = local_278.refcount._4_4_;
      local_208._16_8_ = local_278.elemsize;
      local_208._24_4_ = local_278.elempack;
      local_208._32_8_ = local_278.allocator;
      auStack_1e0._4_4_ = local_278.w;
      auStack_1e0._0_4_ = local_278.dims;
      auStack_1e0._8_4_ = local_278.h;
      auStack_1e0._12_4_ = local_278.d;
      uStack_1d0 = CONCAT44(uStack_1d0._4_4_,local_278.c);
      local_1c8 = local_278.cstep;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      if (uVar28 < uVar55) {
        Mat::create((Mat *)local_208,iVar43,iVar47,
                    (this->super_DeconvolutionDepthWise).num_output / (int)uVar28,
                    (ulong)uVar28 * (uVar48 >> sVar13),uVar28,opt->workspace_allocator);
        local_2d0 = -100;
        if (((void *)local_208._0_8_ != (void *)0x0) && ((long)(int)uStack_1d0 * local_1c8 != 0))
        goto LAB_00462f38;
        bVar8 = false;
      }
      else {
LAB_00462f38:
        iVar52 = (this->super_DeconvolutionDepthWise).group;
        bVar8 = 0 < iVar52;
        if (iVar52 < 1) {
          local_2d0 = -100;
        }
        else {
          local_2d0 = -100;
          iVar54 = 0;
          iVar52 = 0;
          lVar39 = 0;
          do {
            local_e8 = (void *)((long)(iVar54 / iVar33) * local_158 * local_198._16_8_ +
                               local_198._0_8_);
            uStack_e0 = 0;
            uStack_dc = 0;
            local_d8 = local_198._16_8_;
            local_d0 = local_198._24_4_;
            local_c8 = (Allocator *)local_198._32_8_;
            auVar24._4_8_ = local_c0._8_8_;
            auVar24._0_4_ = local_170._4_4_;
            local_c0._0_8_ = auVar24._0_8_ << 0x20;
            local_c0._8_4_ = local_170._8_4_;
            local_c0._12_4_ = local_170._12_4_;
            local_a8 = ((long)(int)local_170._12_4_ * local_198._16_8_ *
                        (long)(int)local_170._8_4_ * (long)(int)local_170._4_4_ + 0xfU &
                       0xfffffffffffffff0) / (ulong)local_198._16_8_;
            local_c0._0_4_ = local_170._0_4_;
            local_138 = (void *)((long)(iVar52 / (int)uVar28) * local_1c8 * local_208._16_8_ +
                                local_208._0_8_);
            uStack_130 = 0;
            uStack_12c = 0;
            local_128 = (Allocator *)local_208._16_8_;
            local_120 = local_208._24_4_;
            local_118 = (Allocator *)local_208._32_8_;
            auVar25._4_8_ = local_110._8_8_;
            auVar25._0_4_ = auStack_1e0._4_4_;
            local_110._0_8_ = auVar25._0_8_ << 0x20;
            local_110._8_4_ = auStack_1e0._8_4_;
            local_110._12_4_ = auStack_1e0._12_4_;
            local_f8 = ((long)(int)auStack_1e0._12_4_ * local_208._16_8_ *
                        (long)(int)auStack_1e0._8_4_ * (long)(int)auStack_1e0._4_4_ + 0xfU &
                       0xfffffffffffffff0) / (ulong)local_208._16_8_;
            local_110._0_4_ = auStack_1e0._0_4_;
            pLVar7 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar39];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            local_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            local_48 = opt->flush_denormals;
            uStack_44._0_1_ = opt->use_local_pool_allocator;
            uStack_44._1_1_ = opt->use_shader_local_memory;
            uStack_44._2_1_ = opt->use_cooperative_matrix;
            uStack_44._3_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_3c._0_1_ = opt->use_int8_uniform;
            uStack_3c._1_1_ = opt->use_reserved_9;
            uStack_3c._2_1_ = opt->use_reserved_10;
            uStack_3c._3_1_ = opt->use_reserved_11;
            pAStack_70 = (Allocator *)local_208._32_8_;
            local_100 = (int)uVar32 / (int)uVar28;
            local_b0 = (int)uVar31 / iVar33;
            iVar43 = (*pLVar7->_vptr_Layer[7])(pLVar7,&local_e8,&local_138,&local_78);
            if (iVar43 != 0) {
              local_2d0 = iVar43;
            }
            piVar4 = (int *)CONCAT44(uStack_12c,uStack_130);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_118 == (Allocator *)0x0) {
                  if (local_138 != (void *)0x0) {
                    free(local_138);
                  }
                }
                else {
                  (*local_118->_vptr_Allocator[3])();
                }
              }
            }
            local_f8 = 0;
            local_138 = (void *)0x0;
            uStack_130 = 0;
            uStack_12c = 0;
            local_128 = (Allocator *)0x0;
            local_120 = 0;
            local_110 = (undefined1  [16])0x0;
            local_100 = 0;
            piVar4 = (int *)CONCAT44(uStack_dc,uStack_e0);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_c8 == (Allocator *)0x0) {
                  if (local_e8 != (void *)0x0) {
                    free(local_e8);
                  }
                }
                else {
                  (*local_c8->_vptr_Allocator[3])();
                }
              }
            }
            local_a8 = 0;
            local_e8 = (void *)0x0;
            uStack_e0 = 0;
            uStack_dc = 0;
            local_d8 = 0;
            local_d0 = 0;
            local_c0 = (undefined1  [16])0x0;
            local_b0 = 0;
            if (iVar43 != 0) break;
            lVar39 = lVar39 + 1;
            lVar46 = (long)(this->super_DeconvolutionDepthWise).group;
            iVar52 = iVar52 + uVar32;
            iVar54 = iVar54 + uVar31;
            bVar8 = lVar39 < lVar46;
          } while (lVar39 < lVar46);
        }
        if (bVar8) {
          bVar8 = false;
        }
        else {
          if (uVar28 < uVar55) {
            convert_packing((Mat *)local_208,&local_278,uVar55,opt);
            if ((local_278.data == (void *)0x0) || ((long)local_278.c * local_278.cstep == 0)) {
              bVar8 = false;
              local_2d0 = -100;
              goto LAB_0046386c;
            }
          }
          else {
            piVar4 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_278.allocator == (Allocator *)0x0) {
                  if (local_278.data != (void *)0x0) {
                    free(local_278.data);
                  }
                }
                else {
                  (*(local_278.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            auVar58 = auStack_1e0;
            local_278.data = (void *)local_208._0_8_;
            local_278.refcount._0_4_ = local_208._8_4_;
            local_278.refcount._4_4_ = local_208._12_4_;
            local_278.elemsize = local_208._16_8_;
            local_278.elempack = local_208._24_4_;
            local_278.allocator = (Allocator *)local_208._32_8_;
            local_278.dims = auStack_1e0._0_4_;
            local_278.w = auStack_1e0._4_4_;
            local_278.h = auStack_1e0._8_4_;
            local_278.d = auStack_1e0._12_4_;
            local_278.c = (int)uStack_1d0;
            local_278.cstep = local_1c8;
            auStack_1e0 = auVar58;
          }
          bVar8 = true;
        }
      }
LAB_0046386c:
      piVar4 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
            if ((void *)local_208._0_8_ != (void *)0x0) {
              free((void *)local_208._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_208._32_8_)[3])();
          }
        }
      }
      local_1c8 = 0;
      local_208._0_8_ = (void *)0x0;
      local_208._8_4_ = 0;
      local_208._12_4_ = 0;
      local_208._16_8_ = (Allocator *)0x0;
      local_208._24_4_ = 0;
      auStack_1e0 = (undefined1  [16])0x0;
      uStack_1d0 = uStack_1d0 & 0xffffffff00000000;
    }
    piVar4 = (int *)CONCAT44(local_198._12_4_,local_198._8_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
          if ((void *)local_198._0_8_ != (void *)0x0) {
            free((void *)local_198._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_198._32_8_)[3])();
        }
      }
    }
    local_158 = 0;
    local_198._0_8_ = (void *)0x0;
    local_198._8_4_ = 0;
    local_198._12_4_ = 0;
    local_198._16_8_ = 0;
    local_198._24_4_ = 0;
    local_170 = (undefined1  [16])0x0;
    local_160 = 0;
    if (!bVar8) goto LAB_00463989;
  }
  pMVar26 = local_1b8;
  DeconvolutionDepthWise::cut_padding(&this->super_DeconvolutionDepthWise,&local_278,local_1b8,opt);
  local_2d0 = -100;
  if ((pMVar26->data != (void *)0x0) &&
     (local_2d0 = -100, (long)local_1b8->c * local_1b8->cstep != 0)) {
    local_2d0 = 0;
  }
LAB_00463989:
  piVar4 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if (local_278.data != (void *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_2d0;
}

Assistant:

int DeconvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}